

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O3

void main_cold_3(void)

{
  fwrite("Output on stdout from grandchild before sleep.\n",0x2f,1,_stdout);
  fwrite("Output on stderr from grandchild before sleep.\n",0x2f,1,_stderr);
  fflush(_stdout);
  fflush(_stderr);
  fclose(_stdout);
  fclose(_stderr);
  sleep(0xf);
  return;
}

Assistant:

static int test8_grandchild(int argc, const char* argv[])
{
  (void)argc;
  (void)argv;
  fprintf(stdout, "Output on stdout from grandchild before sleep.\n");
  fprintf(stderr, "Output on stderr from grandchild before sleep.\n");
  fflush(stdout);
  fflush(stderr);
  /* TODO: Instead of closing pipes here leave them open to make sure
     the grandparent can stop listening when the parent exits.  This
     part of the test cannot be enabled until the feature is
     implemented.  */
  fclose(stdout);
  fclose(stderr);
  testProcess_sleep(15);
  return 0;
}